

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFill.cpp
# Opt level: O3

bool __thiscall CDirectiveFill::Load(CDirectiveFill *this,ArgumentList *Args)

{
  pointer pEVar1;
  
  initExpression(&this->SizeExpression,
                 &((Args->entries).
                   super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                   _M_impl.super__Vector_impl_data._M_start)->text,false);
  pEVar1 = (Args->entries).
           super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(Args->entries).
            super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pEVar1 == 0x50) {
    this->FillByte = true;
    initExpression(&this->ByteExpression,&pEVar1[1].text,false);
  }
  else {
    this->FillByte = false;
    this->Byte = 0;
  }
  return true;
}

Assistant:

bool CDirectiveFill::Load(ArgumentList &Args)
{
	initExpression(SizeExpression,Args[0].text);

	if (Args.size() == 2)	// includes fill byte
	{
		FillByte = true;
		initExpression(ByteExpression,Args[1].text);
	} else {
		FillByte = false;
		Byte = 0;
	}

	return true;
}